

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>::~btree
          (btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
           *this)

{
  if (this->size_ != 0) {
    internal_clear(this,(this->root_).
                        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
                        ._M_head_impl);
  }
  (this->root_).
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        *)&btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
           EmptyNode()::empty_node;
  this->rightmost_ =
       (node_type *)
       &btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
        EmptyNode()::empty_node;
  this->size_ = 0;
  return;
}

Assistant:

~btree() {
            // Put static_asserts in destructor to avoid triggering them before the type
            // is complete.
            static_assert(static_assert_validation(), "This call must be elided.");
            clear();
        }